

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::announce_with_tracker(torrent *this,event_t e)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  session_interface *psVar5;
  value_type *pvVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  session_settings *psVar13;
  element_type *peVar14;
  int64_t iVar15;
  vector<peer_connection_*> *this_00;
  undefined4 extraout_var;
  size_t sVar16;
  reference ae_00;
  ulong uVar17;
  value_type *pvVar18;
  undefined8 uVar19;
  info_hash_t *this_01;
  undefined8 uVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator __first;
  iterator __last;
  int extraout_EDX;
  endpoint *ep;
  endpoint *ep_00;
  optional<long> oVar21;
  undefined8 in_stack_fffffffffffff7c8;
  undefined4 uVar22;
  char *local_788;
  string *local_688;
  int local_604;
  undefined1 local_568 [32];
  weak_ptr<libtorrent::aux::request_callback> local_548;
  tracker_request local_538;
  weak_ptr<libtorrent::aux::request_callback> local_430;
  tracker_request local_420;
  undefined1 local_318 [8];
  shared_ptr<libtorrent::aux::tracker_logger> tl;
  sha1_hash local_2e4;
  time_point local_2d0;
  time_point local_2c8;
  string local_2c0;
  value_type *local_2a0;
  value_type *a;
  value_type *state;
  pointer psStack_288;
  protocol_version ih;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  initializer_list<libtorrent::protocol_version> *__range4_1;
  announce_state *ep_state;
  announce_state *local_260;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
  local_258;
  announce_state *local_250;
  announce_state *local_248;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
  local_240;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
  local_238;
  __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
  aep_state_iter;
  announce_endpoint *aep;
  iterator __end3;
  iterator __begin3;
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
  *__range3;
  announce_entry *ae;
  iterator __end2;
  iterator __begin2;
  tracker_list *__range2;
  undefined1 local_1e0 [4];
  int idx;
  vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
  listen_socket_states;
  time_point32 now;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  function<void_(const_libtorrent::aux::listen_socket_handle_&)> local_1b0;
  undefined8 local_190;
  piece_block_progress pbp;
  peer_connection **c;
  iterator __end4;
  iterator __begin4;
  vector<peer_connection_*> *__range4;
  _Storage<long,_true> local_158;
  undefined1 local_150;
  undefined1 local_138 [8];
  tracker_request req;
  event_t e_local;
  torrent *this_local;
  
  req.i2pconn._7_1_ = e;
  bVar7 = tracker_list::empty(&this->m_trackers);
  if (bVar7) {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"*** announce: no trackers");
  }
  else {
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) != 0) {
      req.i2pconn._7_1_ = stopped;
    }
    if (req.i2pconn._7_1_ == stopped) {
      psVar13 = settings(this);
      iVar9 = session_settings::get_int(psVar13,0x4002);
      if (iVar9 < 1) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** announce: event == stopped && stop_tracker_timeout <= 0");
        return;
      }
    }
    if ((req.i2pconn._7_1_ == stopped) || ((this->field_0x5c0 & 1) != 0)) {
      if ((req.i2pconn._7_1_ == stopped) ||
         ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) == 0)) {
        if (((req.i2pconn._7_1_ == none) && (bVar7 = is_finished(this), bVar7)) &&
           (bVar7 = is_seed(this), !bVar7)) {
          req.i2pconn._7_1_ = paused;
        }
        tracker_request::tracker_request((tracker_request *)local_138);
        psVar13 = settings(this);
        bVar7 = session_settings::get_bool(psVar13,0x802e);
        if ((bVar7) && ((*(uint *)&this->field_0x5d8 >> 0x19 & 1) != 0)) {
          ::std::shared_ptr<const_libtorrent::ip_filter>::operator=
                    ((shared_ptr<const_libtorrent::ip_filter> *)((long)&req.trackerid.field_2 + 8),
                     &this->m_ip_filter);
        }
        peVar14 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        req.outgoing_socket.m_sock.
        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_1_ = torrent_info::priv(peVar14);
        req.pid.m_number._M_elems[2] = (this->m_peer_id).m_number._M_elems[4];
        req.info_hash.m_number._M_elems._12_8_ = *(undefined8 *)(this->m_peer_id).m_number._M_elems;
        req.pid.m_number._M_elems._0_8_ = *(undefined8 *)((this->m_peer_id).m_number._M_elems + 2);
        iVar15 = stat::total_payload_download(&this->m_stat);
        req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iVar15 - this->m_total_failed_bytes);
        req.downloaded = stat::total_payload_upload(&this->m_stat);
        req.left = this->m_total_failed_bytes;
        oVar21 = bytes_left(this);
        local_158._M_value =
             oVar21.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        local_150 = oVar21.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_engaged;
        __range4._4_4_ = 0x4000;
        req.uploaded = ::std::optional<long>::value_or<int>
                                 ((optional<long> *)&local_158,(int *)((long)&__range4 + 4));
        req._240_8_ = ::std::
                      unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                      ::get(&this->m_ssl_ctx);
        req.corrupt = this->m_total_redundant_bytes;
        psVar13 = settings(this);
        bVar7 = session_settings::get_bool(psVar13,0x801d);
        if (!bVar7) {
          req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               req.filter.
               super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi - this->m_total_redundant_bytes;
          bVar7 = is_seed(this);
          if (bVar7) {
            this_00 = &(this->super_torrent_hot_members).m_connections;
            __end4 = ::std::
                     vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ::begin(&this_00->
                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            );
            c = (peer_connection **)
                ::std::
                vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ::end(&this_00->
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     );
            while (bVar7 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                               *)&c), bVar7) {
              pbp._8_8_ = __gnu_cxx::
                          __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                          ::operator*(&__end4);
              iVar9 = (*((*(peer_connection **)pbp._8_8_)->super_bandwidth_socket).
                        _vptr_bandwidth_socket[0x1c])();
              local_190 = CONCAT44(extraout_var,iVar9);
              if (0 < extraout_EDX) {
                req.filter.
                super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     req.filter.
                     super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi - (long)extraout_EDX;
                req.corrupt = extraout_EDX + req.corrupt;
              }
              __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator++(&__end4);
            }
          }
        }
        if ((long)req.filter.
                  super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi < 0) {
          req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        req.redundant._2_1_ = req.i2pconn._7_1_;
        psVar13 = settings(this);
        bVar7 = session_settings::get_bool(psVar13,0x8026);
        if ((!bVar7) &&
           (bVar7 = ::std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)&(this->super_torrent_hot_members).m_torrent_file),
           bVar7)) {
          peVar14 = ::std::
                    __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&(this->super_torrent_hot_members).m_torrent_file);
          bVar7 = torrent_info::priv(peVar14);
          if (bVar7) {
            psVar5 = (this->super_torrent_hot_members).m_ses;
            _now = (unsigned_long)this;
            ::std::function<void(libtorrent::aux::listen_socket_handle_const&)>::
            function<libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::__0,void>
                      ((function<void(libtorrent::aux::listen_socket_handle_const&)> *)&local_1b0,
                       (anon_class_16_2_633ba7cb *)&now);
            (*(psVar5->super_session_logger)._vptr_session_logger[0x24])(psVar5,&local_1b0);
            ::std::function<void_(const_libtorrent::aux::listen_socket_handle_&)>::~function
                      (&local_1b0);
          }
        }
        if (req.redundant._2_1_ == stopped) {
          local_604 = 0;
        }
        else {
          psVar13 = settings(this);
          local_604 = session_settings::get_int(psVar13,0x4016);
        }
        req.listen_port = (undefined2)local_604;
        req.event = local_604._2_1_;
        req.kind.m_val = local_604._3_1_;
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ =
             info_hash_t::has_v1(&this->m_info_hash);
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ =
             info_hash_t::has_v2(&this->m_info_hash);
        container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>::
        container_wrapper((container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                           *)((long)&listen_socket_states.
                                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                          (array<const_bool,_2UL> *)
                          ((long)&listen_socket_states.
                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        listen_socket_states.
        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = time_now32();
        ::std::
        vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ::vector((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                  *)local_1e0);
        __range2._4_4_ = 0xffffffff;
        uVar10 = (*(this->super_request_callback)._vptr_request_callback[6])();
        if ((uVar10 & 1) != 0) {
          psVar13 = settings(this);
          bVar7 = session_settings::get_bool(psVar13,0x8011);
          psVar13 = settings(this);
          bVar8 = session_settings::get_bool(psVar13,0x8012);
          sVar16 = tracker_list::size(&this->m_trackers);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,
                     "*** announce: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
                     ,(ulong)bVar7,(ulong)bVar8,sVar16 & 0xffffffff);
        }
        tracker_list::begin((tracker_list *)&__end2);
        tracker_list::end((tracker_list *)&ae);
        while (bVar7 = boost::intrusive::operator!=
                                 (&__end2,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                           *)&ae), bVar7) {
          ae_00 = boost::intrusive::
                  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                  ::operator*(&__end2);
          __range2._4_4_ = __range2._4_4_ + 1;
          psVar5 = (this->super_torrent_hot_members).m_ses;
          bVar7 = is_ssl_torrent(this);
          anon_unknown_135::refresh_endpoint_list
                    (psVar5,bVar7,(bool)((byte)this->field_0x606 >> 6 & 1),ae_00);
          uVar17 = ::std::__cxx11::string::empty();
          if ((uVar17 & 1) == 0) {
            local_688 = (string *)&ae_00->trackerid;
          }
          else {
            local_688 = (string *)&this->m_trackerid;
          }
          ::std::__cxx11::string::operator=((string *)(req.url.field_2._M_local_buf + 8),local_688);
          ::std::__cxx11::string::operator=((string *)local_138,(string *)&ae_00->url);
          bVar7 = is_i2p_url((string *)local_138);
          if (bVar7) {
            libtorrent::flags::
            bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>::
            operator|=((bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                        *)((long)&req.redundant + 3),
                       (bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                        )0x2);
LAB_006778d7:
            __end3 = ::std::
                     vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                     ::begin(&ae_00->endpoints);
            aep = (announce_endpoint *)
                  ::std::
                  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                  ::end(&ae_00->endpoints);
            while (bVar7 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                                               *)&aep), bVar7) {
              aep_state_iter._M_current =
                   (announce_state *)
                   __gnu_cxx::
                   __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                   ::operator*(&__end3);
              local_240._M_current =
                   (announce_state *)
                   ::std::
                   vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                   ::begin((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            *)local_1e0);
              local_248 = (announce_state *)
                          ::std::
                          vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ::end((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                 *)local_1e0);
              local_250 = aep_state_iter._M_current;
              local_238 = ::std::
                          find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state*,std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>>,libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::__1>
                                    (local_240,
                                     (__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                                      )local_248,aep_state_iter._M_current);
              local_258._M_current =
                   (announce_state *)
                   ::std::
                   vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                   ::end((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          *)local_1e0);
              bVar7 = __gnu_cxx::operator==(&local_238,&local_258);
              if (bVar7) {
                ::std::
                vector<libtorrent::aux::(anonymous_namespace)::announce_state,std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>
                ::emplace_back<libtorrent::aux::listen_socket_handle&>
                          ((vector<libtorrent::aux::(anonymous_namespace)::announce_state,std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>
                            *)local_1e0,
                           (listen_socket_handle *)
                           (aep_state_iter._M_current[5].state.
                            super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                            ._M_elems + 1));
                ep_state = (announce_state *)
                           ::std::
                           vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ::end((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                  *)local_1e0);
                local_260 = (announce_state *)
                            __gnu_cxx::
                            __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                            ::operator-((__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                                         *)&ep_state,1);
                local_238 = (__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                             )local_260;
              }
              __range4_1 = (initializer_list<libtorrent::protocol_version> *)
                           __gnu_cxx::
                           __normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                           ::operator*(&local_238);
              if ((aep_state_iter._M_current[5].state.
                   super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                   ._M_elems[0].tier & 1) != 0) {
                __begin4_1 = libtorrent::(anonymous_namespace)::all_versions;
                __end4_1 = ::std::initializer_list<libtorrent::protocol_version>::begin
                                     ((initializer_list<libtorrent::protocol_version> *)
                                      libtorrent::(anonymous_namespace)::all_versions);
                psStack_288 = (pointer)::std::initializer_list<libtorrent::protocol_version>::end
                                                 ((initializer_list<libtorrent::protocol_version> *)
                                                  libtorrent::(anonymous_namespace)::all_versions);
                for (; (pointer)__end4_1 != psStack_288; __end4_1 = __end4_1 + 1) {
                  state._7_1_ = *__end4_1;
                  pvVar18 = container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                            ::operator[]((container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                                          *)((long)&listen_socket_states.
                                                                                                        
                                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 6),state._7_1_);
                  if ((*pvVar18 & 1U) != 0) {
                    a = (value_type *)
                        container_wrapper<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_libtorrent::protocol_version,_std::array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>_>
                        ::operator[]((container_wrapper<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_libtorrent::protocol_version,_std::array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>_>
                                      *)(__range4_1 + 1),state._7_1_);
                    local_2a0 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                                              *)(aep_state_iter._M_current + 1),state._7_1_);
                    if ((((*(ushort *)&local_2a0->field_0x44 >> 8 & 1) != 0) ||
                        (req.redundant._2_1_ != stopped)) && (((a->message).field_0x5 & 1) == 0)) {
                      uVar10 = (*(this->super_request_callback)._vptr_request_callback[6])();
                      uVar22 = (undefined4)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
                      if ((uVar10 & 1) != 0) {
                        print_endpoint_abi_cxx11_(&local_2c0,(aux *)aep_state_iter._M_current,ep);
                        uVar19 = ::std::__cxx11::string::c_str();
                        uVar20 = ::std::__cxx11::string::c_str();
                        bVar1 = ae_00->tier;
                        uVar4 = *(undefined4 *)&a->message;
                        bVar7 = announce_infohash::is_working(local_2a0);
                        pvVar6 = local_2a0;
                        bVar2 = ae_00->fail_limit;
                        ::std::chrono::
                        time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        ::time_point<std::chrono::duration<int,std::ratio<1l,1l>>,void>
                                  ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                    *)&local_2c8,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                                    *)&listen_socket_states.
                                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        bVar8 = is_seed(this);
                        bVar8 = announce_infohash::can_announce
                                          (pvVar6,local_2c8,bVar8,ae_00->fail_limit);
                        in_stack_fffffffffffff7c8 =
                             CONCAT44(uVar22,(uint)((a->message).field_0x4 & 1));
                        (*(this->super_request_callback)._vptr_request_callback[7])
                                  (this,
                                   "*** tracker:  (%d) [ep: %s ] \"%s\" [  i->tier: %d tier: %d working: %d limit: %d can: %d sent: %d ]"
                                   ,(ulong)__range2._4_4_,uVar19,uVar20,(ulong)bVar1,uVar4,
                                   (uint)bVar7,(uint)bVar2,(uint)bVar8,in_stack_fffffffffffff7c8);
                        ::std::__cxx11::string::~string((string *)&local_2c0);
                      }
                      psVar13 = settings(this);
                      bVar7 = session_settings::get_bool(psVar13,0x8011);
                      if (bVar7) {
                        psVar13 = settings(this);
                        bVar7 = session_settings::get_bool(psVar13,0x8012);
                        if (((!bVar7) && (((a->message).field_0x4 & 1) != 0)) &&
                           (((int)(uint)ae_00->tier <= *(int *)&a->message &&
                            (*(int *)&a->message != 0x7fffffff)))) goto LAB_00678697;
                      }
                      if ((*(int *)&a->message < (int)(uint)ae_00->tier) &&
                         (((a->message).field_0x4 & 1) != 0)) {
                        psVar13 = settings(this);
                        bVar7 = session_settings::get_bool(psVar13,0x8011);
                        if (!bVar7) goto LAB_00678697;
                      }
                      bVar7 = announce_infohash::is_working(local_2a0);
                      pvVar6 = local_2a0;
                      if (bVar7) {
                        *(uint *)&a->message = (uint)ae_00->tier;
                        (a->message).field_0x4 = 0;
                      }
                      ::std::chrono::
                      time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ::time_point<std::chrono::duration<int,std::ratio<1l,1l>>,void>
                                ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                  *)&local_2d0,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                                  *)&listen_socket_states.
                                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      bVar7 = is_seed(this);
                      bVar7 = announce_infohash::can_announce
                                        (pvVar6,local_2d0,bVar7,ae_00->fail_limit);
                      if (bVar7) {
                        req.redundant._2_1_ = req.i2pconn._7_1_;
                        if (req.i2pconn._7_1_ == none) {
                          if ((*(ushort *)&local_2a0->field_0x44 >> 8 & 1) == 0) {
                            req.redundant._2_1_ = started;
                          }
                          else if (((((byte)this->field_0x606 >> 6 & 1) == 0) &&
                                   ((*(ushort *)&local_2a0->field_0x44 >> 9 & 1) == 0)) &&
                                  (bVar7 = is_seed(this), bVar7)) {
                            req.redundant._2_1_ = completed;
                          }
                        }
                        req.outgoing_socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._1_1_ =
                             (byte)((ushort)*(undefined2 *)&local_2a0->field_0x44 >> 10) & 1;
                        *(ushort *)&local_2a0->field_0x44 =
                             *(ushort *)&local_2a0->field_0x44 & 0xfbff;
                        req.redundant._4_4_ = tracker_key(this);
                        listen_socket_handle::operator=
                                  ((listen_socket_handle *)(req.pid.m_number._M_elems + 3),
                                   (listen_socket_handle *)
                                   (aep_state_iter._M_current[5].state.
                                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                    ._M_elems + 1));
                        peVar14 = ::std::
                                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)&(this->super_torrent_hot_members).m_torrent_file)
                        ;
                        this_01 = torrent_info::info_hashes(peVar14);
                        info_hash_t::get(&local_2e4,this_01,state._7_1_);
                        req.info_hash.m_number._M_elems[2] = local_2e4.m_number._M_elems[4];
                        req.ipv4.
                        super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                             local_2e4.m_number._M_elems[0];
                        req.ipv4.
                        super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                             local_2e4.m_number._M_elems[1];
                        req.info_hash.m_number._M_elems[0] = local_2e4.m_number._M_elems[2];
                        req.info_hash.m_number._M_elems[1] = local_2e4.m_number._M_elems[3];
                        uVar10 = (*(this->super_request_callback)._vptr_request_callback[6])();
                        if ((uVar10 & 1) != 0) {
                          uVar20 = ::std::__cxx11::string::c_str();
                          uVar19 = req._240_8_;
                          if (req.redundant._2_1_ == stopped) {
                            local_788 = "stopped";
                          }
                          else {
                            local_788 = "";
                            if (req.redundant._2_1_ == started) {
                              local_788 = "started";
                            }
                          }
                          uVar10 = *(uint *)&(this->super_torrent_hot_members).field_0x48;
                          uVar11 = (*(((this->super_torrent_hot_members).m_ses)->
                                     super_session_logger)._vptr_session_logger[0x20])();
                          uVar12 = (*(((this->super_torrent_hot_members).m_ses)->
                                     super_session_logger)._vptr_session_logger[0x21])();
                          uVar3 = *(ushort *)&local_2a0->field_0x44;
                          print_endpoint_abi_cxx11_
                                    ((string *)
                                     &tl.
                                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(aux *)aep_state_iter._M_current,ep_00);
                          in_stack_fffffffffffff7c8 = ::std::__cxx11::string::c_str();
                          (*(this->super_request_callback)._vptr_request_callback[7])
                                    (this,
                                     "==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p port: %d ssl-port: %d fails: %d upd: %d ep: %s"
                                     ,uVar20,local_788,(ulong)(uVar10 >> 0x1a & 1),uVar19,
                                     uVar11 & 0xffff,uVar12 & 0xffff,uVar3 & 0x7f,uVar3 >> 7 & 1,
                                     in_stack_fffffffffffff7c8);
                          ::std::__cxx11::string::~string
                                    ((string *)
                                     &tl.
                                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                        if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1)
                             == 0) ||
                           (uVar10 = (**(((this->super_torrent_hot_members).m_ses)->
                                        super_session_logger)._vptr_session_logger)(),
                           (uVar10 & 1) == 0)) {
                          psVar5 = (this->super_torrent_hot_members).m_ses;
                          tracker_request::tracker_request(&local_538,(tracker_request *)local_138);
                          ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                                    ((enable_shared_from_this<libtorrent::aux::torrent> *)
                                     (local_568 + 0x10));
                          ::std::weak_ptr<libtorrent::aux::request_callback>::
                          weak_ptr<libtorrent::aux::torrent,void>
                                    (&local_548,
                                     (shared_ptr<libtorrent::aux::torrent> *)(local_568 + 0x10));
                          (*(psVar5->super_session_logger)._vptr_session_logger[0x2f])
                                    (psVar5,&local_538,&local_548);
                          ::std::weak_ptr<libtorrent::aux::request_callback>::~weak_ptr(&local_548);
                          ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                                    ((shared_ptr<libtorrent::aux::torrent> *)(local_568 + 0x10));
                          tracker_request::~tracker_request(&local_538);
                        }
                        else {
                          ::std::
                          make_shared<libtorrent::aux::tracker_logger,libtorrent::aux::session_interface&>
                                    ((session_interface *)local_318);
                          psVar5 = (this->super_torrent_hot_members).m_ses;
                          tracker_request::tracker_request(&local_420,(tracker_request *)local_138);
                          ::std::weak_ptr<libtorrent::aux::request_callback>::
                          weak_ptr<libtorrent::aux::tracker_logger,void>
                                    (&local_430,
                                     (shared_ptr<libtorrent::aux::tracker_logger> *)local_318);
                          (*(psVar5->super_session_logger)._vptr_session_logger[0x2f])
                                    (psVar5,&local_420,&local_430);
                          ::std::weak_ptr<libtorrent::aux::request_callback>::~weak_ptr(&local_430);
                          tracker_request::~tracker_request(&local_420);
                          ::std::shared_ptr<libtorrent::aux::tracker_logger>::~shared_ptr
                                    ((shared_ptr<libtorrent::aux::tracker_logger> *)local_318);
                        }
                        *(ushort *)&local_2a0->field_0x44 = *(ushort *)&local_2a0->field_0x44 | 0x80
                        ;
                        (local_2a0->next_announce).__d.__r =
                             (rep_conflict)
                             listen_socket_states.
                             super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
                        (local_2a0->min_announce).__d.__r =
                             (rep_conflict)
                             listen_socket_states.
                             super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
                        iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                  _vptr_session_logger[5])();
                        bVar7 = alert_manager::should_post<libtorrent::tracker_announce_alert>
                                          ((alert_manager *)CONCAT44(extraout_var_00,iVar9));
                        if (bVar7) {
                          iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger
                                    )._vptr_session_logger[5])();
                          get_handle((torrent *)local_568);
                          alert_manager::
                          emplace_alert<libtorrent::tracker_announce_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string&,libtorrent::protocol_version_const&,libtorrent::event_t&>
                                    ((alert_manager *)CONCAT44(extraout_var_01,iVar9),
                                     (torrent_handle *)local_568,
                                     (basic_endpoint<boost::asio::ip::tcp> *)
                                     aep_state_iter._M_current,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_138,(protocol_version *)((long)&state + 7),
                                     (event_t *)((long)&req.redundant + 2));
                          torrent_handle::~torrent_handle((torrent_handle *)local_568);
                        }
                        (a->message).field_0x4 = 1;
                        bVar7 = announce_infohash::is_working(local_2a0);
                        if (bVar7) {
                          psVar13 = settings(this);
                          bVar7 = session_settings::get_bool(psVar13,0x8012);
                          if (!bVar7) {
                            psVar13 = settings(this);
                            bVar7 = session_settings::get_bool(psVar13,0x8011);
                            if (!bVar7) {
                              (a->message).field_0x5 = 1;
                            }
                          }
                        }
                      }
                      else {
                        bVar7 = announce_infohash::is_working(local_2a0);
                        if (bVar7) {
                          (a->message).field_0x4 = 1;
                          psVar13 = settings(this);
                          bVar7 = session_settings::get_bool(psVar13,0x8012);
                          if (!bVar7) {
                            psVar13 = settings(this);
                            bVar7 = session_settings::get_bool(psVar13,0x8011);
                            if (!bVar7) {
                              (a->message).field_0x5 = 1;
                            }
                          }
                        }
                      }
                    }
                  }
LAB_00678697:
                }
              }
              __gnu_cxx::
              __normal_iterator<libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
              ::operator++(&__end3);
            }
            __first = ::std::
                      vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ::begin((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               *)local_1e0);
            __last = ::std::
                     vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                     ::end((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            *)local_1e0);
            bVar7 = ::std::
                    all_of<__gnu_cxx::__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state*,std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>>>,libtorrent::aux::torrent::announce_with_tracker(libtorrent::event_t)::__2>
                              ((__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                                )__first._M_current,
                               (__normal_iterator<libtorrent::aux::(anonymous_namespace)::announce_state_*,_std::vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>_>
                                )__last._M_current,
                               (anon_class_2_1_d2284f93)
                               listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
            if (bVar7) break;
          }
          else {
            bVar7 = is_i2p(this);
            if (!bVar7) goto LAB_006778d7;
            psVar13 = settings(this);
            bVar7 = session_settings::get_bool(psVar13,0x8017);
            if (bVar7) goto LAB_006778d7;
          }
          boost::intrusive::
          list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
          ::operator++(&__end2);
        }
        update_tracker_timer
                  (this,listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        ::std::
        vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
        ::~vector((vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                   *)local_1e0);
        tracker_request::~tracker_request((tracker_request *)local_138);
      }
      else {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** announce: event != stopped && m_paused");
      }
    }
    else {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** announce: event != stopped && !m_announce_to_trackers");
    }
  }
  return;
}

Assistant:

void torrent::announce_with_tracker(event_t e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e == event_t::stopped || state() != torrent_status::checking_files);
		INVARIANT_CHECK;

		if (m_trackers.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: no trackers");
#endif
			return;
		}

		if (m_abort) e = event_t::stopped;

		// having stop_tracker_timeout <= 0 means that there is
		// no need to send any request to trackers or trigger any
		// related logic when the event is stopped
		if (e == event_t::stopped
			&& settings().get_int(settings_pack::stop_tracker_timeout) <= 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event == stopped && stop_tracker_timeout <= 0");
#endif
			return;
		}

		// if we're not announcing to trackers, only allow
		// stopping
		if (e != event_t::stopped && !m_announce_to_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && !m_announce_to_trackers");
#endif
			return;
		}

		// if we're not allowing peers, there's no point in announcing
		if (e != event_t::stopped && m_paused)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && m_paused");
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused || e == event_t::stopped);

		if (e == event_t::none && is_finished() && !is_seed())
			e = event_t::paused;

		tracker_request req;
		if (settings().get_bool(settings_pack::apply_ip_filter_to_trackers)
			&& m_apply_ip_filter)
		{
			req.filter = m_ip_filter;
		}

		req.private_torrent = m_torrent_file->priv();

		req.pid = m_peer_id;
		req.downloaded = m_stat.total_payload_download() - m_total_failed_bytes;
		req.uploaded = m_stat.total_payload_upload();
		req.corrupt = m_total_failed_bytes;
		req.left = bytes_left().value_or(16 * 1024);
#ifdef TORRENT_SSL_PEERS
		// if this torrent contains an SSL certificate, make sure
		// any SSL tracker presents a certificate signed by it
		req.ssl_ctx = m_ssl_ctx.get();
#endif

		req.redundant = m_total_redundant_bytes;
		// exclude redundant bytes if we should
		if (!settings().get_bool(settings_pack::report_true_downloaded))
		{
			req.downloaded -= m_total_redundant_bytes;

			// if the torrent is complete we know that all incoming pieces will be
			// marked redundant so add them to the redundant count
			// this is mainly needed to cover the case where a torrent has just completed
			// but still has partially downloaded pieces
			// if the incoming pieces are not accounted for it could cause the downloaded
			// amount to exceed the total size of the torrent which upsets some trackers
			if (is_seed())
			{
				for (auto const& c : m_connections)
				{
					TORRENT_INCREMENT(m_iterating_connections);
					auto const pbp = c->downloading_piece_progress();
					if (pbp.bytes_downloaded > 0)
					{
						req.downloaded -= pbp.bytes_downloaded;
						req.redundant += pbp.bytes_downloaded;
					}
				}
			}
		}
		if (req.downloaded < 0) req.downloaded = 0;

		req.event = e;

		// since sending our IPv4/v6 address to the tracker may be sensitive. Only
		// do that if we're not in anonymous mode and if it's a private torrent
		if (!settings().get_bool(settings_pack::anonymous_mode)
			&& m_torrent_file
			&& m_torrent_file->priv())
		{
			m_ses.for_each_listen_socket([&](aux::listen_socket_handle const& s)
			{
				if (s.is_ssl() != is_ssl_torrent()) return;
				tcp::endpoint const ep = s.get_local_endpoint();
				if (ep.address().is_unspecified()) return;
				if (aux::is_v6(ep))
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv6.push_back(ep.address().to_v6());
				}
				else
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv4.push_back(ep.address().to_v4());
				}
			});
		}

		// if we are aborting. we don't want any new peers
		req.num_want = (req.event == event_t::stopped)
			? 0 : settings().get_int(settings_pack::num_want);

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 const now = aux::time_now32();

		// each listen socket gets its own announce state
		// so that each one should get at least one announce
		std::vector<announce_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** announce: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif

		// TODO: it would be nice to raise the abstraction level of the
		// tracker_list or trackers a bit here
		for (auto& ae : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			refresh_endpoint_list(m_ses, is_ssl_torrent(), bool(m_complete_sent), ae);

			// if trackerid is not specified for tracker use default one, probably set explicitly
			req.trackerid = ae.trackerid.empty() ? m_trackerid : ae.trackerid;
			req.url = ae.url;

#if TORRENT_USE_I2P
			if (is_i2p_url(req.url))
			{
				req.kind |= tracker_request::i2p;
			}
			else if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			{
				// if we don't allow mixing normal peers into this i2p
				// torrent, skip this announce
				continue;
			}
#endif

			for (auto& aep : ae.endpoints)
			{
				// do not add code which continues to the next endpoint here!
				// listen_socket_states needs to be populated even if none of the endpoints
				// will be announcing for this tracker
				// otherwise the early bail out when neither announce_to_all_trackers
				// nor announce_to_all_tiers is set may be triggered prematurely

				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](announce_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				announce_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;

				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto& a = aep.info_hashes[ih];

					// if we haven't sent an event=start to the tracker, there's no
					// point in sending an event=stopped
					if (!a.start_sent && req.event == event_t::stopped)
						continue;

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker:  (%d) [ep: %s ] \"%s\" [ "
							" i->tier: %d tier: %d working: %d limit: %d"
							" can: %d sent: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str()
							, ae.url.c_str(), ae.tier, state.tier, a.is_working(), ae.fail_limit
							, a.can_announce(now, is_seed(), ae.fail_limit), state.sent_announce);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.sent_announce
						&& ae.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (ae.tier > state.tier && state.sent_announce
						&& !settings().get_bool(settings_pack::announce_to_all_tiers)) continue;
					if (a.is_working()) { state.tier = ae.tier; state.sent_announce = false; }
					if (!a.can_announce(now, is_seed(), ae.fail_limit))
					{
						// this counts
						if (a.is_working())
						{
							state.sent_announce = true;
							if (!settings().get_bool(settings_pack::announce_to_all_trackers)
								&& !settings().get_bool(settings_pack::announce_to_all_tiers))
							{
								state.done = true;
							}
						}
						continue;
					}

					req.event = e;
					if (req.event == event_t::none)
					{
						if (!a.start_sent) req.event = event_t::started;
						else if (!m_complete_sent
							&& !a.complete_sent
							&& is_seed())
						{
							req.event = event_t::completed;
						}
					}

					req.triggered_manually = a.triggered_manually;
					a.triggered_manually = false;

#if TORRENT_ABI_VERSION == 1
					req.auth = tracker_login();
#endif
					req.key = tracker_key();

					req.outgoing_socket = aep.socket;
					req.info_hash = m_torrent_file->info_hashes().get(ih);

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p "
							"port: %d ssl-port: %d fails: %d upd: %d ep: %s"
							, req.url.c_str()
							, (req.event == event_t::stopped ? "stopped"
								: req.event == event_t::started ? "started" : "")
							, m_abort
#ifdef TORRENT_SSL_PEERS
							, static_cast<void*>(req.ssl_ctx)
#else
							, static_cast<void*>(nullptr)
#endif
							, m_ses.listen_port()
							, m_ses.ssl_listen_port()
							, a.fails
							, a.updating
							, print_endpoint(aep.local_endpoint).c_str());
					}

					// if we're not logging session logs, don't bother creating an
					// observer object just for logging
					if (m_abort && m_ses.should_log())
					{
						auto tl = std::make_shared<aux::tracker_logger>(m_ses);
						m_ses.queue_tracker_request(req, tl);
					}
					else
#endif
					{
						m_ses.queue_tracker_request(req, shared_from_this());
					}

					a.updating = true;
					a.next_announce = now;
					a.min_announce = now;

					if (m_ses.alerts().should_post<tracker_announce_alert>())
					{
						m_ses.alerts().emplace_alert<tracker_announce_alert>(
							get_handle(), aep.local_endpoint, req.url, ih, req.event);
					}

					state.sent_announce = true;
					if (a.is_working()
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
					{
						state.done = true;
					}
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](announce_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}
		update_tracker_timer(now);
	}